

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_long>
          (Memory *this,u64 offset,u64 addend,unsigned_long expect,unsigned_long replace,
          unsigned_long *out)

{
  bool bVar1;
  Result RVar2;
  unsigned_long local_48;
  unsigned_long read;
  unsigned_long *out_local;
  unsigned_long replace_local;
  unsigned_long expect_local;
  u64 addend_local;
  u64 offset_local;
  Memory *this_local;
  
  read = (unsigned_long)out;
  out_local = (unsigned_long *)replace;
  replace_local = expect;
  expect_local = addend;
  addend_local = offset;
  offset_local = (u64)this;
  RVar2 = AtomicLoad<unsigned_long>(this,offset,addend,&local_48);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (local_48 == replace_local) {
      RVar2 = AtomicStore<unsigned_long>(this,addend_local,expect_local,(unsigned_long)out_local);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    *(unsigned_long *)read = local_48;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmwCmpxchg(u64 offset,
                                u64 addend,
                                T expect,
                                T replace,
                                T* out) {
  T read;
  CHECK_RESULT(AtomicLoad(offset, addend, &read));
  if (read == expect) {
    CHECK_RESULT(AtomicStore(offset, addend, replace));
  }
  *out = read;
  return Result::Ok;
}